

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

char * basic_get(amqp_connection_state_t connection_state_,char *queue_name_,
                uint64_t *out_body_size_)

{
  amqp_time_t time;
  amqp_bytes_t queue;
  int iVar1;
  char *__dest;
  size_t *in_RDX;
  bool bVar2;
  char *body;
  amqp_message_t message;
  int time_rc;
  timeval timeout;
  amqp_time_t deadline;
  amqp_rpc_reply_t rpc_reply;
  uint7 in_stack_fffffffffffffe28;
  timeval *in_stack_fffffffffffffe40;
  amqp_time_t *in_stack_fffffffffffffe48;
  amqp_boolean_t in_stack_fffffffffffffe88;
  amqp_channel_t in_stack_fffffffffffffe8e;
  amqp_connection_state_t in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  amqp_message_t *in_stack_fffffffffffffea0;
  amqp_channel_t in_stack_fffffffffffffeae;
  amqp_connection_state_t in_stack_fffffffffffffeb0;
  size_t local_d8;
  void *local_d0;
  int local_78;
  int local_70;
  
  iVar1 = amqp_time_from_now(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  if (iVar1 != 0) {
    __assert_fail("time_rc == AMQP_STATUS_OK",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x5f,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
  }
  do {
    amqp_cstring_bytes((char *)0x102740);
    queue.len._4_4_ = in_stack_fffffffffffffe9c;
    queue.len._0_4_ = in_stack_fffffffffffffe98;
    queue.bytes = in_stack_fffffffffffffea0;
    amqp_basic_get(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8e,queue,
                   in_stack_fffffffffffffe88);
    bVar2 = false;
    if ((local_78 == 1) && (bVar2 = false, local_70 == 0x3c0048)) {
      time.time_point_ns._7_1_ = 0;
      time.time_point_ns._0_7_ = in_stack_fffffffffffffe28;
      iVar1 = amqp_time_has_past(time);
      bVar2 = iVar1 == 0;
    }
    iVar1 = (int)in_stack_fffffffffffffe40;
  } while (bVar2);
  if (local_78 != 1) {
    __assert_fail("rpc_reply.reply_type == AMQP_RESPONSE_NORMAL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x68,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
  }
  if (local_70 != 0x3c0047) {
    __assert_fail("rpc_reply.reply.id == AMQP_BASIC_GET_OK_METHOD",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x69,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
  }
  amqp_read_message(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeae,in_stack_fffffffffffffea0,
                    in_stack_fffffffffffffe9c);
  if (iVar1 != 1) {
    __assert_fail("rpc_reply.reply_type == AMQP_RESPONSE_NORMAL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x6e,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
  }
  __dest = (char *)malloc(local_d8);
  memcpy(__dest,local_d0,local_d8);
  *in_RDX = local_d8;
  amqp_destroy_message((amqp_message_t *)0x102921);
  return __dest;
}

Assistant:

char *basic_get(amqp_connection_state_t connection_state_,
                const char *queue_name_, uint64_t *out_body_size_) {
  amqp_rpc_reply_t rpc_reply;
  amqp_time_t deadline;
  struct timeval timeout = {5, 0};
  int time_rc = amqp_time_from_now(&deadline, &timeout);
  assert(time_rc == AMQP_STATUS_OK);

  do {
    rpc_reply = amqp_basic_get(connection_state_, fixed_channel_id,
                               amqp_cstring_bytes(queue_name_), /*no_ack*/ 1);
  } while (rpc_reply.reply_type == AMQP_RESPONSE_NORMAL &&
           rpc_reply.reply.id == AMQP_BASIC_GET_EMPTY_METHOD &&
           amqp_time_has_past(deadline) == AMQP_STATUS_OK);

  assert(rpc_reply.reply_type == AMQP_RESPONSE_NORMAL);
  assert(rpc_reply.reply.id == AMQP_BASIC_GET_OK_METHOD);

  amqp_message_t message;
  rpc_reply =
      amqp_read_message(connection_state_, fixed_channel_id, &message, 0);
  assert(rpc_reply.reply_type == AMQP_RESPONSE_NORMAL);

  char *body = malloc(message.body.len);
  memcpy(body, message.body.bytes, message.body.len);
  *out_body_size_ = message.body.len;
  amqp_destroy_message(&message);

  return body;
}